

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_expr.cpp
# Opt level: O1

FProduction * ParseExpression(FCommandLine *argv,int *parsept)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  char *str;
  FProduction *pFVar4;
  FDoubleProd *pFVar5;
  FStringProd *pFVar6;
  long lVar7;
  FProduction *prod1;
  FProduction *prod2;
  FDoubleProd *local_58;
  FProduction *local_50;
  double local_48;
  undefined8 uStack_40;
  
  iVar3 = *parsept;
  iVar2 = FCommandLine::argc(argv);
  if (iVar2 <= iVar3) {
    return (FProduction *)0x0;
  }
  iVar3 = *parsept;
  *parsept = iVar3 + 1;
  str = FCommandLine::operator[](argv,iVar3);
  local_58 = (FDoubleProd *)0x0;
  local_50 = (FProduction *)0x0;
  bVar1 = IsFloat(str);
  if (bVar1) {
    local_48 = atof(str);
    pFVar4 = (FProduction *)
             M_Malloc_Dbg(0x10,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/c_expr.cpp"
                          ,0x151);
    pFVar4->Type = PROD_Double;
    *(double *)(pFVar4 + 2) = local_48;
    return pFVar4;
  }
  iVar3 = strcasecmp(str,"true");
  if (iVar3 == 0) {
    pFVar4 = (FProduction *)
             M_Malloc_Dbg(0x10,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/c_expr.cpp"
                          ,0x151);
    pFVar4->Type = PROD_Double;
    *(undefined8 *)(pFVar4 + 2) = 0x3ff0000000000000;
    return pFVar4;
  }
  iVar3 = strcasecmp(str,"false");
  if (iVar3 == 0) {
    pFVar4 = (FProduction *)
             M_Malloc_Dbg(0x10,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/c_expr.cpp"
                          ,0x151);
    pFVar4->Type = PROD_Double;
    *(undefined8 *)(pFVar4 + 2) = 0;
    return pFVar4;
  }
  pFVar4 = (FProduction *)0x0;
  lVar7 = 0;
  do {
    iVar3 = strcmp(Producers[0].Token + lVar7,str);
    if (iVar3 == 0) {
      pFVar5 = (FDoubleProd *)ParseExpression(argv,parsept);
      local_58 = pFVar5;
      local_50 = ParseExpression(argv,parsept);
      if (local_50 == (FProduction *)0x0 || pFVar5 == (FDoubleProd *)0x0) {
        iVar3 = 5;
        pFVar4 = (FProduction *)0x0;
      }
      else {
        if (*(long *)(Producers[0].Token + lVar7 + 0x10) == 0) {
          DoubleCoerce((FProduction **)&local_58,&local_50);
        }
        else if (*(long *)(Producers[0].Token + lVar7 + 8) == 0) {
          MustStringCoerce((FProduction **)&local_58,&local_50);
        }
        else {
          MaybeStringCoerce((FProduction **)&local_58,&local_50);
        }
        if ((local_58->super_FProduction).Type == PROD_String) {
          pFVar4 = (FProduction *)
                   (**(code **)(Producers[0].Token + lVar7 + 0x10))(local_58,local_50);
        }
        else {
          pFVar4 = (FProduction *)(**(code **)(Producers[0].Token + lVar7 + 8))(local_58,local_50);
        }
        iVar3 = 6;
      }
      goto LAB_0035aa6f;
    }
    lVar7 = lVar7 + 0x18;
  } while (lVar7 != 0x1c8);
  iVar3 = 2;
LAB_0035aa6f:
  if (iVar3 != 6) {
    if (iVar3 != 5) {
      if (iVar3 != 2) {
        return pFVar4;
      }
      iVar3 = strcmp("!",str);
      if (iVar3 != 0) {
        pFVar6 = NewStringProd(str);
        return &pFVar6->super_FProduction;
      }
      local_58 = (FDoubleProd *)ParseExpression(argv,parsept);
      if (local_58 != (FDoubleProd *)0x0) {
        if ((local_58->super_FProduction).Type == PROD_String) {
          local_58 = StringToDouble((FProduction *)local_58);
        }
        local_48 = (double)(-(ulong)(local_58->Value == 0.0) & 0x3ff0000000000000);
        uStack_40 = 0;
        pFVar4 = (FProduction *)
                 M_Malloc_Dbg(0x10,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/c_expr.cpp"
                              ,0x151);
        pFVar4->Type = PROD_Double;
        *(double *)(pFVar4 + 2) = local_48;
        goto LAB_0035ab2d;
      }
    }
    Printf("Missing argument to %s\n",str);
  }
LAB_0035ab2d:
  if (local_50 != (FProduction *)0x0) {
    M_Free(local_50);
  }
  if (local_58 != (FDoubleProd *)0x0) {
    M_Free(local_58);
  }
  return pFVar4;
}

Assistant:

static FProduction *ParseExpression (FCommandLine &argv, int &parsept)
{
	if (parsept >= argv.argc())
		return NULL;

	const char *token = argv[parsept++];
	FProduction *prod1 = NULL, *prod2 = NULL, *prod3 = NULL;

	if (IsFloat (token))
	{
		return NewDoubleProd (atof(token));
	}
	else if (stricmp (token, "true") == 0)
	{
		return NewDoubleProd (1.0);
	}
	else if (stricmp (token, "false") == 0)
	{
		return NewDoubleProd (0.0);
	}
	else
	{
		for (size_t i = 0; i < countof(Producers); ++i)
		{
			if (strcmp (Producers[i].Token, token) == 0)
			{
				prod1 = ParseExpression (argv, parsept);
				prod2 = ParseExpression (argv, parsept);
				if (prod1 == NULL || prod2 == NULL)
				{
					goto missing;
				}
				if (Producers[i].StringProducer == NULL)
				{
					DoubleCoerce (prod1, prod2);
				}
				else if (Producers[i].DoubleProducer == NULL)
				{
					MustStringCoerce (prod1, prod2);
				}
				else
				{
					MaybeStringCoerce (prod1, prod2);
				}
				if (prod1->Type == PROD_String)
				{
					prod3 = Producers[i].StringProducer ((FStringProd *)prod1, (FStringProd *)prod2);
				}
				else
				{
					prod3 = Producers[i].DoubleProducer ((FDoubleProd *)prod1, (FDoubleProd *)prod2);
				}
				goto done;
			}
		}
		if (strcmp ("!", token) == 0)
		{
			prod1 = ParseExpression (argv, parsept);
			if (prod1 == NULL)
			{
				goto missing;
			}
			if (prod1->Type == PROD_String)
			{
				prod1 = StringToDouble (prod1);
			}
			prod3 = NewDoubleProd (!static_cast<FDoubleProd *>(prod1)->Value);
			goto done;
		}
		return NewStringProd (token);
	}

missing:
	Printf ("Missing argument to %s\n", token);

done:
	if (prod2 != NULL) M_Free (prod2);
	if (prod1 != NULL) M_Free (prod1);
	return prod3;
}